

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

int ON_RowReduce(int row_count,int col_count,double zero_pivot,double **A,double **B,double *pivots)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double local_70;
  
  if (pivots != (double *)0x0) {
    *pivots = 0.0;
    pivots[1] = 0.0;
  }
  if ((zero_pivot <= 0.0) || (bVar5 = ON_IsValid(zero_pivot), !bVar5)) {
    zero_pivot = 0.0;
  }
  uVar15 = (ulong)(uint)row_count;
  if (row_count < 1) {
    dVar18 = **A;
    uVar11 = 0;
    bVar5 = false;
    local_70 = dVar18;
  }
  else {
    uVar11 = 0;
    do {
      memset(B[uVar11],0,(long)col_count * 8);
      if ((long)uVar11 < (long)col_count) {
        B[uVar11][uVar11] = 1.0;
      }
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
    dVar18 = **A;
    local_70 = dVar18;
    if (row_count < 1) {
      uVar11 = 0;
      bVar5 = false;
    }
    else {
      bVar5 = true;
      uVar16 = 1;
      uVar11 = 0;
      do {
        pdVar10 = A[uVar11];
        dVar1 = pdVar10[uVar11];
        dVar17 = ABS(dVar1);
        dVar4 = dVar17;
        if ((dVar18 <= dVar17) && (dVar4 = dVar18, local_70 < dVar17)) {
          local_70 = dVar17;
        }
        dVar18 = dVar4;
        if ((dVar1 != 1.0) || (NAN(dVar1))) {
          if ((dVar17 <= zero_pivot) || (bVar6 = ON_IsValid(dVar1), !bVar6)) goto LAB_004f3d36;
          iVar7 = (int)uVar11 + 1;
          pdVar10 = A[uVar11];
          if (col_count != iVar7) {
            lVar12 = 1;
            do {
              pdVar10[uVar11 + lVar12] = pdVar10[uVar11 + lVar12] * (1.0 / dVar1);
              lVar12 = lVar12 + 1;
            } while (col_count - (int)uVar11 != (int)lVar12);
          }
          pdVar2 = B[uVar11];
          lVar12 = 0;
          do {
            pdVar2[lVar12] = pdVar2[lVar12] * (1.0 / dVar1);
            lVar12 = lVar12 + 1;
          } while (iVar7 != (int)lVar12);
        }
        uVar9 = uVar11 + 1;
        bVar5 = (long)uVar9 < (long)uVar15;
        if ((long)uVar9 < (long)uVar15) {
          uVar14 = uVar16;
          do {
            pdVar2 = A[uVar14];
            dVar1 = pdVar2[uVar11];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              if (col_count != (int)uVar9) {
                lVar12 = 0;
                do {
                  pdVar2[uVar9 + lVar12] = pdVar10[uVar9 + lVar12] * -dVar1 + pdVar2[uVar9 + lVar12]
                  ;
                  lVar12 = lVar12 + 1;
                } while (col_count - (int)uVar9 != (int)lVar12);
              }
              pdVar2 = B[uVar11];
              pdVar3 = B[uVar14];
              uVar13 = 0;
              do {
                pdVar3[uVar13] = pdVar2[uVar13] * -dVar1 + pdVar3[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar16 != uVar13);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar15);
        }
        uVar16 = uVar16 + 1;
        uVar11 = uVar9;
      } while (uVar9 != uVar15);
      uVar11 = (ulong)(uint)row_count;
    }
  }
LAB_004f3d36:
  if (pivots != (double *)0x0) {
    *pivots = dVar18;
    pivots[1] = local_70;
  }
  iVar7 = (int)uVar11;
  if (!bVar5) {
    iVar7 = row_count;
  }
  if (!(bool)(row_count < 1 | bVar5)) {
    uVar8 = row_count - 2;
    do {
      if (uVar15 < 2) {
        return row_count;
      }
      uVar11 = uVar15 - 1;
      uVar16 = (ulong)uVar8;
      do {
        dVar18 = A[uVar16][uVar11];
        if (((dVar18 != 0.0) || (NAN(dVar18))) && (col_count != 0)) {
          pdVar10 = B[uVar16];
          pdVar2 = B[uVar11];
          lVar12 = 0;
          do {
            pdVar10[lVar12] = pdVar2[lVar12] * -dVar18 + pdVar10[lVar12];
            lVar12 = lVar12 + 1;
          } while (col_count != (int)lVar12);
        }
        iVar7 = (int)uVar16;
        uVar16 = uVar16 - 1;
      } while (0 < iVar7);
      uVar8 = uVar8 - 1;
      bVar5 = 1 < uVar15;
      uVar15 = uVar11;
      iVar7 = row_count;
    } while (bVar5);
  }
  return iVar7;
}

Assistant:

int ON_RowReduce( int row_count, 
                  int col_count,
                  double zero_pivot,
                  double** A, 
                  double** B, 
                  double pivots[2] 
                 )
{
  // returned A is identity, B = inverse of input A
  const int M = row_count;
  const int N = col_count;
  const size_t sizeof_row = N*sizeof(A[0][0]);
  int i, j, ii;
  double a, p, p0, p1;
  const double* ptr0;
  double* ptr1;

  if ( pivots )
  {
    pivots[0] = 0.0;
    pivots[1] = 0.0;
  }

  if ( zero_pivot <= 0.0 || !ON_IsValid(zero_pivot) )
    zero_pivot = 0.0;


  for ( i = 0; i < M; i++ )
  {
    memset(B[i],0,sizeof_row);
    if ( i < N )
      B[i][i] = 1.0;
  }

  p0 = p1 = A[0][0];

  for ( i = 0; i < M; i++ )
  {
    p = fabs(a = A[i][i]);
    if ( p < p0 ) p0 = p; else if (p > p1) p1 = p;
    if ( 1.0 != a )
    {
      if ( p <= zero_pivot || !ON_IsValid(a) )
      {
        break;
      }
      a = 1.0/a;

      //A[i][i] = 1.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = i+1; j < N; j++ )
      //  A[i][j] *= a;
      //      
      j = i+1;
      ptr1 = A[i] + j;
      j = N - j;
      while(j--) *ptr1++ *= a;
      
      // The "ptr" voodoo is faster but does the same thing as
      //
      //for ( j = 0; j <= i; j++ )
      //  B[i][j] *= a;
      //            
      ptr1 = B[i];
      j = i+1;
      while(j--) *ptr1++ *= a;
    }

    for ( ii = i+1; ii < M; ii++ )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      
      //A[ii][i] = 0.0;  // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = i+1; j < N; j++ )
      //  A[ii][j] += a*A[i][j];
      //
      j = i+1;
      ptr0 = A[i] + j;
      ptr1 = A[ii] + j;
      j = N - j;
      while(j--) *ptr1++ += a* *ptr0++;

      for( j = 0; j <= i; j++ )
        B[ii][j] += a*B[i][j];
    }
  }

  if ( pivots )
  {
    pivots[0] = p0;
    pivots[1] = p1;
  }

  if ( i < M )
  {
    return i;
  }


  // A is now upper triangular with all 1s on diagonal 
  //   (That is, if the lines that say "no need to do this" are used.)
  // B is lower triangular with a nonzero diagonal
  for ( i = M-1; i >= 0; i-- )
  {
    for ( ii = i-1; ii >= 0; ii-- )
    {
      a = A[ii][i];
      if ( 0.0 == a )
        continue;
      a = -a;
      //A[ii][i] = 0.0; // no need to do this

      // The "ptr" voodoo is faster but does the same thing as
      //
      //for( j = 0; j < N; j++ )
      //  B[ii][j] += a*B[i][j];
      //
      ptr0 = B[i];
      ptr1 = B[ii];
      j = N;
      while(j--) *ptr1++ += a* *ptr0++;
    }
  }

  // At this point, A is trash.
  // If the input A was really nice (positive definite....)
  // the B = inverse of the input A.  If A was not nice,
  // B is also trash.
  return M;
}